

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O3

void __thiscall
tonk::LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::rehash
          (LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher> *this,
          uint new_hash_size)

{
  raw_node *prVar1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  raw_node *prVar5;
  ulong uVar6;
  ulong *puVar7;
  raw_node *prVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  raw_node *prVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  
  uVar3 = this->m_num_valid;
  if ((uVar3 <= new_hash_size) && (uVar4 = this->m_values_count, uVar4 != new_hash_size)) {
    uVar10 = (ulong)new_hash_size;
    prVar5 = this->m_values;
    puVar7 = (ulong *)operator_new__(uVar10 * 0x18 + 8);
    *puVar7 = uVar10;
    prVar8 = (raw_node *)(puVar7 + 1);
    if (new_hash_size != 0) {
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar19 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar21 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar12 = 0;
      auVar26 = vpbroadcastq_avx512f();
      auVar26 = vpsrlq_avx512f(auVar26,4);
      do {
        auVar27 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar27,auVar25);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 3) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 6) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 9) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0xc) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0xf) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0x12) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0x15) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0x18) = 0;
        }
        auVar28 = vporq_avx512f(auVar27,auVar24);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 0x1b) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0x1e) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0x21) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0x24) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0x27) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0x2a) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0x2d) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0x30) = 0;
        }
        auVar28 = vporq_avx512f(auVar27,auVar23);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 0x33) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0x36) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0x39) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0x3c) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0x3f) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0x42) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0x45) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0x48) = 0;
        }
        auVar28 = vporq_avx512f(auVar27,auVar22);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 0x4b) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0x4e) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0x51) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0x54) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0x57) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0x5a) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0x5d) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0x60) = 0;
        }
        auVar28 = vporq_avx512f(auVar27,auVar21);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 99) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0x66) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0x69) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0x6c) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0x6f) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0x72) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0x75) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0x78) = 0;
        }
        auVar28 = vporq_avx512f(auVar27,auVar20);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 0x7b) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0x7e) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0x81) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0x84) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0x87) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0x8a) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0x8d) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0x90) = 0;
        }
        auVar28 = vporq_avx512f(auVar27,auVar19);
        uVar6 = vpcmpuq_avx512f(auVar28,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 0x93) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0x96) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0x99) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0x9c) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0x9f) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0xa2) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0xa5) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0xa8) = 0;
        }
        auVar27 = vporq_avx512f(auVar27,auVar18);
        uVar6 = vpcmpuq_avx512f(auVar27,auVar26,2);
        if ((uVar6 & 1) != 0) {
          *(undefined1 *)(puVar7 + 0xab) = 0;
        }
        if ((uVar6 & 2) != 0) {
          *(undefined1 *)(puVar7 + 0xae) = 0;
        }
        if ((uVar6 & 4) != 0) {
          *(undefined1 *)(puVar7 + 0xb1) = 0;
        }
        if ((uVar6 & 8) != 0) {
          *(undefined1 *)(puVar7 + 0xb4) = 0;
        }
        if ((uVar6 & 0x10) != 0) {
          *(undefined1 *)(puVar7 + 0xb7) = 0;
        }
        if ((uVar6 & 0x20) != 0) {
          *(undefined1 *)(puVar7 + 0xba) = 0;
        }
        if ((uVar6 & 0x40) != 0) {
          *(undefined1 *)(puVar7 + 0xbd) = 0;
        }
        if ((uVar6 & 0x80) != 0) {
          *(undefined1 *)(puVar7 + 0xc0) = 0;
        }
        uVar12 = uVar12 + 0x40;
        puVar7 = puVar7 + 0xc0;
      } while (((uVar10 * 0x18 - 0x18) / 0x18 + 0x40 & 0xffffffffffffffc0) != uVar12);
    }
    this->m_values = prVar8;
    this->m_values_count = new_hash_size;
    this->m_num_valid = 0;
    uVar9 = (LZCOUNT(new_hash_size) ^ 0xffffffe0U) + 0x21;
    this->m_hash_shift = uVar9;
    if ((ulong)uVar4 != 0) {
      uVar10 = 0;
      uVar11 = 0;
      do {
        uVar2 = prVar5[uVar10].m_bits[0x10];
        if (uVar2 != '\0') {
          prVar1 = prVar5 + uVar10;
          uVar14 = (uint)(*(int *)prVar1->m_bits * -0x61c88647) >> (uVar9 & 0x1f);
          prVar13 = prVar8 + uVar14;
          if (prVar13->m_bits[0x10] != '\0') {
            uVar17 = this->m_values_count - 1;
            uVar15 = uVar14;
            do {
              uVar16 = uVar15 - 1;
              if (uVar15 == 0) {
                uVar16 = uVar17;
              }
              if (uVar16 == uVar14) goto LAB_0014060c;
              prVar13 = prVar13 + -1;
              if (uVar15 == 0) {
                prVar13 = prVar8 + uVar17;
              }
              uVar15 = uVar16;
            } while (prVar13->m_bits[0x10] != '\0');
          }
          *(int *)prVar13->m_bits = *(int *)prVar1->m_bits;
          uVar11 = uVar11 + 1;
          *(undefined8 *)(prVar13->m_bits + 8) = *(undefined8 *)(prVar1->m_bits + 8);
          prVar13->m_bits[0x10] = uVar2;
          prVar1->m_bits[0x10] = '\0';
          this->m_num_valid = uVar11;
LAB_0014060c:
          if (uVar3 == uVar11) break;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar4);
    }
    this->m_grow_threshold = new_hash_size + 1 >> 1;
    if (prVar5 != (raw_node *)0x0) {
      operator_delete__(prVar5[-1].m_bits + 0x10);
      return;
    }
  }
  return;
}

Assistant:

inline void rehash(unsigned new_hash_size)
    {
        TONK_DEBUG_ASSERT(new_hash_size >= m_num_valid);
        TONK_DEBUG_ASSERT((new_hash_size & (new_hash_size - 1)) == 0); // ispow2

        if ((new_hash_size < m_num_valid) ||
            (new_hash_size == m_values_count))
        {
            return;
        }

        raw_node* old_values = m_values;
        const unsigned old_values_count = m_values_count;
        const unsigned old_num_valid = m_num_valid;

        m_values = new raw_node[new_hash_size];
        m_values_count = new_hash_size;

        m_num_valid = 0;
        const unsigned bitIndex = NonzeroLowestBitIndex(new_hash_size);
        m_hash_shift = 32 - bitIndex;
        TONK_DEBUG_ASSERT(new_hash_size == (1U << (32 - m_hash_shift)));

        for (unsigned i = 0; i < old_values_count; ++i)
        {
            node* pNode = reinterpret_cast<node*>( old_values + i );

            if (pNode->state)
            {
                move_into(pNode);

                if (old_num_valid == m_num_valid) {
                    break;
                }
            }
        }

        m_grow_threshold = (new_hash_size + 1) >> 1;

        delete[] old_values;
    }